

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.h
# Opt level: O0

filemgr_config * __thiscall filemgr_config::operator=(filemgr_config *this,filemgr_config *config)

{
  int *in_RSI;
  filemgr_config *in_RDI;
  atomic<unsigned_long> *new_val;
  atomic<unsigned_long> *in_stack_ffffffffffffffe0;
  atomic<unsigned_long> *atomic_val;
  
  in_RDI->blocksize = *in_RSI;
  in_RDI->ncacheblock = in_RSI[1];
  in_RDI->flag = in_RSI[2];
  in_RDI->seqtree_opt = *(uint8_t *)((long)in_RSI + 0x11);
  in_RDI->chunksize = in_RSI[3];
  in_RDI->options = (uint8_t)in_RSI[4];
  in_RDI->prefetch_duration = *(uint64_t *)(in_RSI + 6);
  in_RDI->num_wal_shards = *(uint16_t *)(in_RSI + 8);
  in_RDI->num_bcache_shards = *(uint16_t *)((long)in_RSI + 0x22);
  memcpy(&in_RDI->encryption_key,in_RSI + 9,0x24);
  new_val = &in_RDI->block_reusing_threshold;
  atomic_get_uint64_t(in_stack_ffffffffffffffe0,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(in_stack_ffffffffffffffe0,(uint64_t)new_val,memory_order_relaxed);
  atomic_val = &in_RDI->num_keeping_headers;
  atomic_get_uint64_t(atomic_val,(memory_order)((ulong)new_val >> 0x20));
  atomic_store_uint64_t(atomic_val,(uint64_t)new_val,memory_order_relaxed);
  in_RDI->do_not_cache_doc_blocks = (bool)(*(byte *)(in_RSI + 0x16) & 1);
  in_RDI->num_blocks_readahead = in_RSI[0x17];
  return in_RDI;
}

Assistant:

filemgr_config& operator=(const filemgr_config& config) {
        blocksize = config.blocksize;
        ncacheblock = config.ncacheblock;
        flag = config.flag;
        seqtree_opt = config.seqtree_opt;
        chunksize = config.chunksize;
        options = config.options;
        prefetch_duration = config.prefetch_duration;
        num_wal_shards = config.num_wal_shards;
        num_bcache_shards = config.num_bcache_shards;
        encryption_key = config.encryption_key;
        atomic_store_uint64_t(&block_reusing_threshold,
                              atomic_get_uint64_t(&config.block_reusing_threshold,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_keeping_headers,
                              atomic_get_uint64_t(&config.num_keeping_headers,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        do_not_cache_doc_blocks = config.do_not_cache_doc_blocks;
        num_blocks_readahead = config.num_blocks_readahead;
        return *this;
    }